

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O2

NucleusPtr __thiscall
glauber::anon_unknown_6::create_nucleus(anon_unknown_6 *this,VarMap *var_map,size_t index)

{
  any *paVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference species;
  double *pdVar2;
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"projectile",&local_39);
  paVar1 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  this_00 = boost::
            any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                      (paVar1);
  species = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(this_00,index);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string(local_38,"nucleon-width",&local_39);
  paVar1 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar2 = boost::any_cast<double_const&>(paVar1);
  std::__cxx11::string::~string(local_38);
  Nucleus::create((Nucleus *)this,species,*pdVar2);
  return (__uniq_ptr_data<glauber::Nucleus,_std::default_delete<glauber::Nucleus>,_true,_true>)
         (__uniq_ptr_data<glauber::Nucleus,_std::default_delete<glauber::Nucleus>,_true,_true>)this;
}

Assistant:

NucleusPtr create_nucleus(const VarMap& var_map, std::size_t index) {
  const auto& species = var_map["projectile"]
                        .as<std::vector<std::string>>().at(index);
  const auto& nucleon_width = var_map["nucleon-width"] .as<double>();
  return Nucleus::create(species, nucleon_width);
}